

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.c
# Opt level: O0

void MOVEGEN_piece(int type,int position,bitboard_t own,bitboard_t opponent,bitboard_t *moves,
                  bitboard_t *captures)

{
  bitboard_t *captures_local;
  bitboard_t *moves_local;
  bitboard_t opponent_local;
  bitboard_t own_local;
  int position_local;
  int type_local;
  
  switch(type) {
  case 0:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gustafullberg[P]drosophila/src/engine/movegen.c"
                  ,0xa1,
                  "void MOVEGEN_piece(const int, const int, const bitboard_t, const bitboard_t, bitboard_t *, bitboard_t *)"
                 );
  case 1:
    MOVEGEN_knight(position,own,opponent,moves,captures);
    break;
  case 2:
    MOVEGEN_bishop(position,own,opponent,moves,captures);
    break;
  case 3:
    MOVEGEN_rook(position,own,opponent,moves,captures);
    break;
  case 4:
    MOVEGEN_queen(position,own,opponent,moves,captures);
    break;
  case 5:
    MOVEGEN_king(position,own,opponent,moves,captures);
  }
  return;
}

Assistant:

void MOVEGEN_piece(const int type, const int position, const bitboard_t own, const bitboard_t opponent, bitboard_t *moves, bitboard_t *captures)
{
    switch(type) {
    case PAWN:
        /* MOVEGEN_all_pawns should be used instead */
        assert(0);
        break;
    case KNIGHT:
        MOVEGEN_knight(position, own, opponent, moves, captures);
        break;
    case BISHOP:
        MOVEGEN_bishop(position, own, opponent, moves, captures);
        break;
    case ROOK:
        MOVEGEN_rook(position, own, opponent, moves, captures);
        break;
    case QUEEN:
        MOVEGEN_queen(position, own, opponent, moves, captures);
        break;
    case KING:
        MOVEGEN_king(position, own, opponent, moves, captures);
        break;
    default:
        break;
    }
}